

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcx.c
# Opt level: O1

void decode_256(FILE *f,uint w,uint h)

{
  uint uVar1;
  uint __c;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  uchar *local_48;
  
  local_48 = pcx_buf;
  if (pcx.encoding == '\0') {
    fread(pcx_buf,(ulong)w,(ulong)h,(FILE *)f);
    fgetc((FILE *)f);
    return;
  }
  if (pcx.encoding != '\x01') {
    error("Unsupported PCX encoding scheme!");
    return;
  }
  uVar3 = 0;
  uVar4 = 0;
  do {
    __c = fgetc((FILE *)f);
    if (__c == 0xffffffff) {
      __c = 0xffffffff;
      break;
    }
    if ((~__c & 0xc0) == 0) {
      uVar5 = __c & 0x3f;
      __c = fgetc((FILE *)f);
    }
    else {
      uVar5 = 1;
    }
    uVar1 = uVar5 - 1;
    memset(local_48,__c,(ulong)uVar1 + 1);
    do {
      uVar3 = uVar3 + 1;
      bVar6 = uVar3 == w;
      if (bVar6) {
        uVar3 = 0;
      }
      uVar4 = uVar4 + bVar6;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
    local_48 = local_48 + (ulong)uVar1 + 1;
  } while (uVar4 < h);
  iVar2 = -1;
  if (__c == 0xffffffff) goto LAB_00111acd;
  while( true ) {
    iVar2 = fgetc((FILE *)f);
LAB_00111acd:
    if (iVar2 == -1) break;
    if (iVar2 == 0xc) {
      fread(pcx_pal,0x300,1,(FILE *)f);
      pcx_nb_colors = 0x100;
      return;
    }
  }
  pcx_nb_colors = 0x100;
  return;
}

Assistant:

void
decode_256(FILE *f, unsigned int w, unsigned int h)
{
	unsigned int   i, c, x, y;
	unsigned char *ptr;

	ptr = pcx_buf;
	x = 0;
	y = 0;

	/* decode */
	switch (pcx.encoding) {
	case 0:
		/* raw */
		fread(pcx_buf, w, h, f);
		c = fgetc(f);
		return;

	case 1:
		/* simple run-length encoding */
		do {
			c = fgetc(f);
			if (c ==  uEOF)
				break;
			if ((c & 0xC0) != 0xC0)
				i = 1;
			else {
				i = (c & 0x3F);
				c = fgetc(f);
			}
			do {
				x++;
			   *ptr++ = c;
				if (x == w) {
					x = 0;
					y++;
				}
			} while (--i);
		} while (y < h);
		break;

	default:
		error("Unsupported PCX encoding scheme!");
		return;
	}			

	/* get the palette */
	if (c != uEOF)
		c = fgetc(f);
	while ((c != 12) && (c != uEOF))
		c = fgetc(f);
	if (c == 12)
		fread(pcx_pal, 768, 1, f);

	/* number of colors */
	pcx_nb_colors = 256;
}